

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall
vkb::detail::GenericFeatureChain::find_and_match
          (GenericFeatureChain *this,GenericFeatureChain *extensions_requested)

{
  pointer pGVar1;
  pointer pGVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  GenericFeaturesPNextNode *requested_extension_node;
  pointer requested;
  GenericFeaturesPNextNode *supported_node;
  pointer supported;
  bool bVar6;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  
  requested = (extensions_requested->nodes).
              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (extensions_requested->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar6 = requested == pGVar1;
    if (bVar6) {
      return bVar6;
    }
    supported = (this->nodes).
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pGVar2 = (this->nodes).
             super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (supported == pGVar2) {
      bVar5 = 4;
      bVar4 = 1;
    }
    else {
      bVar4 = 0;
      do {
        if (supported->sType == requested->sType) {
          bVar3 = GenericFeaturesPNextNode::match(requested,supported);
          bVar5 = bVar3 * '\x03' + 1;
          bVar4 = 1;
          goto LAB_0011dfd6;
        }
        supported = supported + 1;
      } while (supported != pGVar2);
      bVar5 = 4;
LAB_0011dfd6:
      bVar4 = ~bVar4 & 1;
    }
    if (bVar5 != 4) {
      bVar4 = bVar5;
    }
    if (bVar4 != 0) {
      return bVar6;
    }
    requested = requested + 1;
  } while( true );
}

Assistant:

bool GenericFeatureChain::find_and_match(GenericFeatureChain const& extensions_requested) const noexcept {
    for (const auto& requested_extension_node : extensions_requested.nodes) {
        bool found = false;
        for (const auto& supported_node : nodes) {
            if (supported_node.sType == requested_extension_node.sType) {
                found = true;
                if (!GenericFeaturesPNextNode::match(requested_extension_node, supported_node)) return false;
                break;
            }
        }
        if (!found) return false;
    }
    return true;
}